

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O3

void __thiscall
Centaurus::NFABase<Centaurus::LDFAState<wchar_t>_>::print
          (NFABase<Centaurus::LDFAState<wchar_t>_> *this,wostream *os,wstring *graph_name)

{
  long *plVar1;
  wostream *pwVar2;
  pointer pLVar3;
  pointer pLVar4;
  ulong uVar5;
  wchar_t wVar6;
  ulong uVar7;
  
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,L"digraph ",8);
  pwVar2 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                     (os,(graph_name->_M_dataplus)._M_p,graph_name->_M_string_length);
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar2,L" {",2);
  plVar1 = *(long **)(pwVar2 + *(long *)(*(long *)pwVar2 + -0x18) + 0xf0);
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x50))(plVar1,10);
    std::wostream::put((wchar_t)pwVar2);
    std::wostream::flush();
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,L"rankdir=\"LR\";",0xd);
    plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 0x50))(plVar1,10);
      wVar6 = (wchar_t)os;
      std::wostream::put(wVar6);
      std::wostream::flush();
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                (os,L"graph [ charset=\"UTF-8\", style=\"filled\" ];",0x2a);
      plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 0x50))(plVar1,10);
        std::wostream::put(wVar6);
        std::wostream::flush();
        std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                  (os,L"node [ style=\"solid,filled\" ];",0x1e);
        plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
        if (plVar1 != (long *)0x0) {
          (**(code **)(*plVar1 + 0x50))(plVar1,10);
          std::wostream::put(wVar6);
          std::wostream::flush();
          std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                    (os,L"edge [ style=\"solid\" ];",0x17);
          plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
          if (plVar1 != (long *)0x0) {
            (**(code **)(*plVar1 + 0x50))(plVar1,10);
            std::wostream::put(wVar6);
            std::wostream::flush();
            pLVar3 = (this->m_states).
                     super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pLVar4 = (this->m_states).
                     super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (pLVar4 != pLVar3) {
              uVar7 = 0;
              do {
                std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,L"S",1);
                pwVar2 = std::wostream::_M_insert<unsigned_long>((ulong)os);
                std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar2,L" [ label=\"",10);
                (*this->_vptr_NFABase[2])(this,os,uVar7);
                std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                          (os,L"\", shape=circle ];",0x12);
                plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
                if (plVar1 == (long *)0x0) goto LAB_0013f405;
                (**(code **)(*plVar1 + 0x50))(plVar1,10);
                std::wostream::put(wVar6);
                std::wostream::flush();
                pLVar4 = (this->m_states).
                         super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                pLVar3 = (this->m_states).
                         super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                uVar7 = (ulong)((int)uVar7 + 1);
                uVar5 = ((long)pLVar4 - (long)pLVar3 >> 4) * -0x3333333333333333;
              } while (uVar7 <= uVar5 && uVar5 - uVar7 != 0);
            }
            if (pLVar4 != pLVar3) {
              uVar7 = 0;
              do {
                (*pLVar3[uVar7].
                  super_NFABaseState<wchar_t,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
                  ._vptr_NFABaseState[2])(pLVar3 + uVar7,os,uVar7);
                pLVar3 = (this->m_states).
                         super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                uVar7 = (ulong)((int)uVar7 + 1);
                uVar5 = ((long)(this->m_states).
                               super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar3 >> 4) *
                        -0x3333333333333333;
              } while (uVar7 <= uVar5 && uVar5 - uVar7 != 0);
            }
            std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,L"}",1);
            plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
            if (plVar1 != (long *)0x0) {
              (**(code **)(*plVar1 + 0x50))(plVar1,10);
              std::wostream::put(wVar6);
              std::wostream::flush();
              return;
            }
          }
        }
      }
    }
  }
LAB_0013f405:
  std::__throw_bad_cast();
}

Assistant:

virtual void print(std::wostream& os, const std::wstring& graph_name) const
	{
		os << L"digraph " << graph_name << L" {" << std::endl;
		os << L"rankdir=\"LR\";" << std::endl;
		os << L"graph [ charset=\"UTF-8\", style=\"filled\" ];" << std::endl;
		os << L"node [ style=\"solid,filled\" ];" << std::endl;
		os << L"edge [ style=\"solid\" ];" << std::endl;

		for (unsigned int i = 0; i < m_states.size(); i++)
		{
			os << L"S" << i << L" [ label=\"";
			print_state(os, i);
			os << L"\", shape=circle ];" << std::endl;
		}

		for (unsigned int i = 0; i < m_states.size(); i++)
		{
			m_states[i].print(os, i);
		}

		os << L"}" << std::endl;
	}